

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::ReorganizeDataLayerParams::ByteSizeLong(ReorganizeDataLayerParams *this)

{
  ReorganizeDataLayerParams_ReorganizationType RVar1;
  int iVar2;
  uint64 uVar3;
  size_t sVar4;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  ReorganizeDataLayerParams *this_local;
  
  sStack_18 = 0;
  uVar3 = blocksize(this);
  if (uVar3 != 0) {
    uVar3 = blocksize(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar3);
    sStack_18 = sStack_18 + 1;
  }
  RVar1 = mode(this);
  if (RVar1 != ReorganizeDataLayerParams_ReorganizationType_SPACE_TO_DEPTH) {
    RVar1 = mode(this);
    sVar4 = google::protobuf::internal::WireFormatLite::EnumSize(RVar1);
    sStack_18 = sVar4 + 1 + sStack_18;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t ReorganizeDataLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ReorganizeDataLayerParams)
  size_t total_size = 0;

  // uint64 blockSize = 2;
  if (this->blocksize() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->blocksize());
  }

  // .CoreML.Specification.ReorganizeDataLayerParams.ReorganizationType mode = 1;
  if (this->mode() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->mode());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}